

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterStep2(char *aBuf,int *pnBuf)

{
  int iVar1;
  int iVar2;
  int nBuf;
  int ret;
  int *pnBuf_local;
  char *aBuf_local;
  
  iVar1 = *pnBuf;
  switch(aBuf[iVar1 + -2]) {
  case 'a':
    if ((iVar1 < 8) || (iVar2 = memcmp("ational",aBuf + (iVar1 + -7),7), iVar2 != 0)) {
      if ((6 < iVar1) &&
         ((iVar2 = memcmp("tional",aBuf + (iVar1 + -6),6), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -6), iVar2 != 0)))) {
        builtin_strncpy(aBuf + (iVar1 + -6),"tion",4);
        *pnBuf = iVar1 + -2;
      }
    }
    else {
      iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -7);
      if (iVar2 != 0) {
        (aBuf + (iVar1 + -7))[0] = 'a';
        (aBuf + (iVar1 + -7))[1] = 't';
        aBuf[(long)(iVar1 + -7) + 2] = 'e';
        *pnBuf = iVar1 + -4;
      }
    }
    break;
  case 'c':
    if ((iVar1 < 5) || (iVar2 = memcmp("enci",aBuf + (iVar1 + -4),4), iVar2 != 0)) {
      if ((4 < iVar1) &&
         ((iVar2 = memcmp("anci",aBuf + (iVar1 + -4),4), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -4), iVar2 != 0)))) {
        builtin_strncpy(aBuf + (iVar1 + -4),"ance",4);
        *pnBuf = iVar1;
      }
    }
    else {
      iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -4);
      if (iVar2 != 0) {
        builtin_strncpy(aBuf + (iVar1 + -4),"ence",4);
        *pnBuf = iVar1;
      }
    }
    break;
  case 'e':
    if (((4 < iVar1) && (iVar2 = memcmp("izer",aBuf + (iVar1 + -4),4), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -4), iVar2 != 0)) {
      (aBuf + (iVar1 + -4))[0] = 'i';
      (aBuf + (iVar1 + -4))[1] = 'z';
      aBuf[(long)(iVar1 + -4) + 2] = 'e';
      *pnBuf = iVar1 + -1;
    }
    break;
  case 'g':
    if (((4 < iVar1) && (iVar2 = memcmp("logi",aBuf + (iVar1 + -4),4), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -4), iVar2 != 0)) {
      (aBuf + (iVar1 + -4))[0] = 'l';
      (aBuf + (iVar1 + -4))[1] = 'o';
      aBuf[(long)(iVar1 + -4) + 2] = 'g';
      *pnBuf = iVar1 + -1;
    }
    break;
  case 'l':
    if ((iVar1 < 4) || (iVar2 = memcmp("bli",aBuf + (iVar1 + -3),3), iVar2 != 0)) {
      if ((iVar1 < 5) || (iVar2 = memcmp("alli",aBuf + (iVar1 + -4),4), iVar2 != 0)) {
        if ((iVar1 < 6) || (iVar2 = memcmp("entli",aBuf + (iVar1 + -5),5), iVar2 != 0)) {
          if ((iVar1 < 4) || (iVar2 = memcmp("eli",aBuf + (iVar1 + -3),3), iVar2 != 0)) {
            if (((5 < iVar1) && (iVar2 = memcmp("ousli",aBuf + (iVar1 + -5),5), iVar2 == 0)) &&
               (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -5), iVar2 != 0)) {
              (aBuf + (iVar1 + -5))[0] = 'o';
              (aBuf + (iVar1 + -5))[1] = 'u';
              aBuf[(long)(iVar1 + -5) + 2] = 's';
              *pnBuf = iVar1 + -2;
            }
          }
          else {
            iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -3);
            if (iVar2 != 0) {
              aBuf[iVar1 + -3] = 'e';
              *pnBuf = iVar1 + -2;
            }
          }
        }
        else {
          iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -5);
          if (iVar2 != 0) {
            (aBuf + (iVar1 + -5))[0] = 'e';
            (aBuf + (iVar1 + -5))[1] = 'n';
            aBuf[(long)(iVar1 + -5) + 2] = 't';
            *pnBuf = iVar1 + -2;
          }
        }
      }
      else {
        iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -4);
        if (iVar2 != 0) {
          (aBuf + (iVar1 + -4))[0] = 'a';
          (aBuf + (iVar1 + -4))[1] = 'l';
          *pnBuf = iVar1 + -2;
        }
      }
    }
    else {
      iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -3);
      if (iVar2 != 0) {
        (aBuf + (iVar1 + -3))[0] = 'b';
        (aBuf + (iVar1 + -3))[1] = 'l';
        aBuf[(long)(iVar1 + -3) + 2] = 'e';
        *pnBuf = iVar1;
      }
    }
    break;
  case 'o':
    if ((iVar1 < 8) || (iVar2 = memcmp("ization",aBuf + (iVar1 + -7),7), iVar2 != 0)) {
      if ((iVar1 < 6) || (iVar2 = memcmp("ation",aBuf + (iVar1 + -5),5), iVar2 != 0)) {
        if (((4 < iVar1) && (iVar2 = memcmp("ator",aBuf + (iVar1 + -4),4), iVar2 == 0)) &&
           (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -4), iVar2 != 0)) {
          (aBuf + (iVar1 + -4))[0] = 'a';
          (aBuf + (iVar1 + -4))[1] = 't';
          aBuf[(long)(iVar1 + -4) + 2] = 'e';
          *pnBuf = iVar1 + -1;
        }
      }
      else {
        iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -5);
        if (iVar2 != 0) {
          (aBuf + (iVar1 + -5))[0] = 'a';
          (aBuf + (iVar1 + -5))[1] = 't';
          aBuf[(long)(iVar1 + -5) + 2] = 'e';
          *pnBuf = iVar1 + -2;
        }
      }
    }
    else {
      iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -7);
      if (iVar2 != 0) {
        (aBuf + (iVar1 + -7))[0] = 'i';
        (aBuf + (iVar1 + -7))[1] = 'z';
        aBuf[(long)(iVar1 + -7) + 2] = 'e';
        *pnBuf = iVar1 + -4;
      }
    }
    break;
  case 's':
    if ((iVar1 < 6) || (iVar2 = memcmp("alism",aBuf + (iVar1 + -5),5), iVar2 != 0)) {
      if ((iVar1 < 8) || (iVar2 = memcmp("iveness",aBuf + (iVar1 + -7),7), iVar2 != 0)) {
        if ((iVar1 < 8) || (iVar2 = memcmp("fulness",aBuf + (iVar1 + -7),7), iVar2 != 0)) {
          if ((7 < iVar1) &&
             ((iVar2 = memcmp("ousness",aBuf + (iVar1 + -7),7), iVar2 == 0 &&
              (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -7), iVar2 != 0)))) {
            (aBuf + (iVar1 + -7))[0] = 'o';
            (aBuf + (iVar1 + -7))[1] = 'u';
            aBuf[(long)(iVar1 + -7) + 2] = 's';
            *pnBuf = iVar1 + -4;
          }
        }
        else {
          iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -7);
          if (iVar2 != 0) {
            (aBuf + (iVar1 + -7))[0] = 'f';
            (aBuf + (iVar1 + -7))[1] = 'u';
            aBuf[(long)(iVar1 + -7) + 2] = 'l';
            *pnBuf = iVar1 + -4;
          }
        }
      }
      else {
        iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -7);
        if (iVar2 != 0) {
          (aBuf + (iVar1 + -7))[0] = 'i';
          (aBuf + (iVar1 + -7))[1] = 'v';
          aBuf[(long)(iVar1 + -7) + 2] = 'e';
          *pnBuf = iVar1 + -4;
        }
      }
    }
    else {
      iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -5);
      if (iVar2 != 0) {
        (aBuf + (iVar1 + -5))[0] = 'a';
        (aBuf + (iVar1 + -5))[1] = 'l';
        *pnBuf = iVar1 + -3;
      }
    }
    break;
  case 't':
    if ((iVar1 < 6) || (iVar2 = memcmp("aliti",aBuf + (iVar1 + -5),5), iVar2 != 0)) {
      if ((iVar1 < 6) || (iVar2 = memcmp("iviti",aBuf + (iVar1 + -5),5), iVar2 != 0)) {
        if (((6 < iVar1) && (iVar2 = memcmp("biliti",aBuf + (iVar1 + -6),6), iVar2 == 0)) &&
           (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -6), iVar2 != 0)) {
          (aBuf + (iVar1 + -6))[0] = 'b';
          (aBuf + (iVar1 + -6))[1] = 'l';
          aBuf[(long)(iVar1 + -6) + 2] = 'e';
          *pnBuf = iVar1 + -3;
        }
      }
      else {
        iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -5);
        if (iVar2 != 0) {
          (aBuf + (iVar1 + -5))[0] = 'i';
          (aBuf + (iVar1 + -5))[1] = 'v';
          aBuf[(long)(iVar1 + -5) + 2] = 'e';
          *pnBuf = iVar1 + -2;
        }
      }
    }
    else {
      iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -5);
      if (iVar2 != 0) {
        (aBuf + (iVar1 + -5))[0] = 'a';
        (aBuf + (iVar1 + -5))[1] = 'l';
        *pnBuf = iVar1 + -3;
      }
    }
  }
  return 0;
}

Assistant:

static int fts5PorterStep2(char *aBuf, int *pnBuf){
  int ret = 0;
  int nBuf = *pnBuf;
  switch( aBuf[nBuf-2] ){
    
    case 'a': 
      if( nBuf>7 && 0==memcmp("ational", &aBuf[nBuf-7], 7) ){
        if( fts5Porter_MGt0(aBuf, nBuf-7) ){
          memcpy(&aBuf[nBuf-7], "ate", 3);
          *pnBuf = nBuf - 7 + 3;
        }
      }else if( nBuf>6 && 0==memcmp("tional", &aBuf[nBuf-6], 6) ){
        if( fts5Porter_MGt0(aBuf, nBuf-6) ){
          memcpy(&aBuf[nBuf-6], "tion", 4);
          *pnBuf = nBuf - 6 + 4;
        }
      }
      break;
  
    case 'c': 
      if( nBuf>4 && 0==memcmp("enci", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt0(aBuf, nBuf-4) ){
          memcpy(&aBuf[nBuf-4], "ence", 4);
          *pnBuf = nBuf - 4 + 4;
        }
      }else if( nBuf>4 && 0==memcmp("anci", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt0(aBuf, nBuf-4) ){
          memcpy(&aBuf[nBuf-4], "ance", 4);
          *pnBuf = nBuf - 4 + 4;
        }
      }
      break;
  
    case 'e': 
      if( nBuf>4 && 0==memcmp("izer", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt0(aBuf, nBuf-4) ){
          memcpy(&aBuf[nBuf-4], "ize", 3);
          *pnBuf = nBuf - 4 + 3;
        }
      }
      break;
  
    case 'g': 
      if( nBuf>4 && 0==memcmp("logi", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt0(aBuf, nBuf-4) ){
          memcpy(&aBuf[nBuf-4], "log", 3);
          *pnBuf = nBuf - 4 + 3;
        }
      }
      break;
  
    case 'l': 
      if( nBuf>3 && 0==memcmp("bli", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt0(aBuf, nBuf-3) ){
          memcpy(&aBuf[nBuf-3], "ble", 3);
          *pnBuf = nBuf - 3 + 3;
        }
      }else if( nBuf>4 && 0==memcmp("alli", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt0(aBuf, nBuf-4) ){
          memcpy(&aBuf[nBuf-4], "al", 2);
          *pnBuf = nBuf - 4 + 2;
        }
      }else if( nBuf>5 && 0==memcmp("entli", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt0(aBuf, nBuf-5) ){
          memcpy(&aBuf[nBuf-5], "ent", 3);
          *pnBuf = nBuf - 5 + 3;
        }
      }else if( nBuf>3 && 0==memcmp("eli", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt0(aBuf, nBuf-3) ){
          memcpy(&aBuf[nBuf-3], "e", 1);
          *pnBuf = nBuf - 3 + 1;
        }
      }else if( nBuf>5 && 0==memcmp("ousli", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt0(aBuf, nBuf-5) ){
          memcpy(&aBuf[nBuf-5], "ous", 3);
          *pnBuf = nBuf - 5 + 3;
        }
      }
      break;
  
    case 'o': 
      if( nBuf>7 && 0==memcmp("ization", &aBuf[nBuf-7], 7) ){
        if( fts5Porter_MGt0(aBuf, nBuf-7) ){
          memcpy(&aBuf[nBuf-7], "ize", 3);
          *pnBuf = nBuf - 7 + 3;
        }
      }else if( nBuf>5 && 0==memcmp("ation", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt0(aBuf, nBuf-5) ){
          memcpy(&aBuf[nBuf-5], "ate", 3);
          *pnBuf = nBuf - 5 + 3;
        }
      }else if( nBuf>4 && 0==memcmp("ator", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt0(aBuf, nBuf-4) ){
          memcpy(&aBuf[nBuf-4], "ate", 3);
          *pnBuf = nBuf - 4 + 3;
        }
      }
      break;
  
    case 's': 
      if( nBuf>5 && 0==memcmp("alism", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt0(aBuf, nBuf-5) ){
          memcpy(&aBuf[nBuf-5], "al", 2);
          *pnBuf = nBuf - 5 + 2;
        }
      }else if( nBuf>7 && 0==memcmp("iveness", &aBuf[nBuf-7], 7) ){
        if( fts5Porter_MGt0(aBuf, nBuf-7) ){
          memcpy(&aBuf[nBuf-7], "ive", 3);
          *pnBuf = nBuf - 7 + 3;
        }
      }else if( nBuf>7 && 0==memcmp("fulness", &aBuf[nBuf-7], 7) ){
        if( fts5Porter_MGt0(aBuf, nBuf-7) ){
          memcpy(&aBuf[nBuf-7], "ful", 3);
          *pnBuf = nBuf - 7 + 3;
        }
      }else if( nBuf>7 && 0==memcmp("ousness", &aBuf[nBuf-7], 7) ){
        if( fts5Porter_MGt0(aBuf, nBuf-7) ){
          memcpy(&aBuf[nBuf-7], "ous", 3);
          *pnBuf = nBuf - 7 + 3;
        }
      }
      break;
  
    case 't': 
      if( nBuf>5 && 0==memcmp("aliti", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt0(aBuf, nBuf-5) ){
          memcpy(&aBuf[nBuf-5], "al", 2);
          *pnBuf = nBuf - 5 + 2;
        }
      }else if( nBuf>5 && 0==memcmp("iviti", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt0(aBuf, nBuf-5) ){
          memcpy(&aBuf[nBuf-5], "ive", 3);
          *pnBuf = nBuf - 5 + 3;
        }
      }else if( nBuf>6 && 0==memcmp("biliti", &aBuf[nBuf-6], 6) ){
        if( fts5Porter_MGt0(aBuf, nBuf-6) ){
          memcpy(&aBuf[nBuf-6], "ble", 3);
          *pnBuf = nBuf - 6 + 3;
        }
      }
      break;
  
  }
  return ret;
}